

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  char *pcVar1;
  byte bVar2;
  IRRef1 IVar3;
  uint uVar4;
  IRIns *pIVar5;
  IRIns *pIVar6;
  bool bVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint ref_00;
  TRef TVar12;
  TRef TVar13;
  SnapShot *pSVar14;
  SnapEntry *map_00;
  IRIns *pIVar15;
  IRIns *pIVar16;
  GCtrace *in_RSI;
  jit_State *in_RDI;
  IRIns *irc;
  IRIns *newref;
  IRRef newref_ref;
  IRRef keyref;
  IRRef allocref;
  IRIns *irf;
  IRIns *irk;
  TRef tmp;
  TRef key;
  TRef val;
  IRIns *irr;
  TRef tr_1;
  IRIns *irs_1;
  uint8_t m_1;
  TRef op2;
  TRef op1;
  IRIns *ir_2;
  IRRef refp_1;
  SnapEntry sn_2;
  IRIns *irs;
  uint8_t m;
  IRIns *ir_1;
  IRRef refp;
  SnapEntry sn_1;
  IRIns *irlast;
  uint32_t mode;
  IRType t;
  TRef tr;
  IRIns *ir;
  IRRef ref;
  BCReg s;
  SnapEntry sn;
  int pass23;
  BloomFilter seen;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  IRIns *in_stack_fffffffffffffe38;
  IRRef ref_01;
  IRIns *in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  IRIns *in_stack_fffffffffffffe58;
  IRIns *in_stack_fffffffffffffe60;
  TRef local_194;
  uint local_190;
  TRef local_18c;
  IRIns *local_178;
  IRRef1 local_168;
  IRRef1 local_164;
  IRIns *local_150;
  uint local_11c;
  ulong local_100;
  uint local_f4;
  uint local_24;
  uint local_4;
  
  pSVar14 = in_RSI->snap + in_RDI->exitno;
  map_00 = in_RSI->snapmap + pSVar14->mapofs;
  uVar10 = (uint)pSVar14->nent;
  local_100 = 0;
  bVar7 = false;
  in_RDI->framedepth = 0;
  for (local_f4 = 0; local_f4 < uVar10; local_f4 = local_f4 + 1) {
    uVar4 = map_00[local_f4];
    uVar11 = uVar4 >> 0x18;
    ref_00 = uVar4 & 0xffff;
    pIVar5 = in_RSI->ir;
    if (((local_100 & 1L << ((byte)ref_00 & 0x3f)) == 0) ||
       (local_11c = snap_dedup(in_RDI,map_00,local_f4,ref_00), local_11c == 0)) {
      local_100 = 1L << ((byte)ref_00 & 0x3f) | local_100;
      if (ref_00 < 0x8000) {
        local_11c = snap_replay_const((jit_State *)&in_stack_fffffffffffffe38->field_0,
                                      (IRIns *)CONCAT17(in_stack_fffffffffffffe37,
                                                        CONCAT16(in_stack_fffffffffffffe36,
                                                                 in_stack_fffffffffffffe30)));
      }
      else if (((&pIVar5->field_0)[ref_00].prev & 0xff80) == 0x80) {
        bVar7 = true;
        local_11c = uVar11;
      }
      else {
        uVar9 = 0x21;
        if ((&pIVar5->field_1)[ref_00].o == 'F') {
          uVar9 = (&pIVar5->field_0)[ref_00].op2 & 0x10 | 0x21;
        }
        (in_RDI->fold).ins.field_0.ot = (&pIVar5->field_1)[ref_00].t.irt & 0x1f | 0x4600;
        *(ushort *)&(in_RDI->fold).ins = (ushort)(byte)(uVar4 >> 0x18);
        (in_RDI->fold).ins.field_0.op2 = uVar9;
        local_11c = lj_ir_emit((jit_State *)&in_stack_fffffffffffffe40->field_0);
      }
    }
    in_RDI->slot[uVar11] = local_11c | uVar4 & 0x30000;
    in_stack_fffffffffffffe37 = (uVar4 & 0x30000) != 0 && uVar11 != 0;
    in_RDI->framedepth = (uint)(byte)in_stack_fffffffffffffe37 + in_RDI->framedepth;
    if ((uVar4 & 0x10000) != 0) {
      in_RDI->baseslot = uVar11 + 1;
    }
  }
  if (bVar7) {
    pIVar5 = in_RSI->ir;
    uVar9 = pSVar14->ref;
    bVar7 = false;
    for (local_f4 = 0; local_f4 < uVar10; local_f4 = local_f4 + 1) {
      uVar4 = map_00[local_f4];
      pIVar15 = in_RSI->ir + (uVar4 & 0xffff);
      ref_01 = (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      if ((pIVar15->field_1).r == 0xfd) {
        if (in_RDI->slot[uVar4 >> 0x18] == uVar4 >> 0x18) {
          bVar7 = true;
          bVar2 = lj_ir_mode[(pIVar15->field_1).o];
          if ((bVar2 & 3) == 0) {
            snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                      (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                      (SnapEntry *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe4c,(BloomFilter)in_stack_fffffffffffffe40,ref_01);
          }
          if (((int)(uint)bVar2 >> 2 & 3U) == 0) {
            snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                      (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                      (SnapEntry *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe4c,(BloomFilter)in_stack_fffffffffffffe40,
                      (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          }
          local_150 = pIVar15;
          if ((pIVar15->field_1).o != 'R') {
            while (pIVar6 = local_150, local_150 = pIVar6 + 1, local_150 < pIVar5 + uVar9) {
              if (*(char *)((long)pIVar6 + 0xe) == -2) {
                if (*(char *)((long)pIVar6 + 0xf) == -1) {
                  local_4 = snap_sunk_store2(in_RSI,pIVar15,local_150);
                }
                else {
                  local_4 = (uint)(pIVar15 + (int)(uint)*(byte *)((long)pIVar6 + 0xf) == local_150);
                }
                if ((local_4 != 0) &&
                   (TVar12 = snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                                       (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                                       (SnapEntry *)
                                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                                       ,in_stack_fffffffffffffe4c,
                                       (BloomFilter)in_stack_fffffffffffffe40,
                                       (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20)),
                   TVar12 == 0)) {
                  snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                            (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                            (SnapEntry *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe4c,(BloomFilter)in_stack_fffffffffffffe40,
                            (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                }
              }
            }
          }
        }
      }
      else if ((0x7fff < (uVar4 & 0xffff)) && (((pIVar15->field_0).prev & 0xff80) == 0x80)) {
        TVar12 = snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                           (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                           (SnapEntry *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe4c,(BloomFilter)in_stack_fffffffffffffe40,ref_01);
        in_RDI->slot[uVar4 >> 0x18] = TVar12;
      }
    }
    for (local_f4 = 0; in_stack_fffffffffffffe36 = bVar7 && local_f4 < uVar10,
        bVar7 && local_f4 < uVar10; local_f4 = local_f4 + 1) {
      uVar4 = map_00[local_f4];
      pIVar15 = in_RSI->ir + (uVar4 & 0xffff);
      if ((pIVar15->field_1).r == 0xfd) {
        if (in_RDI->slot[uVar4 >> 0x18] == uVar4 >> 0x18) {
          local_164 = (pIVar15->field_0).op1;
          bVar2 = lj_ir_mode[(pIVar15->field_1).o];
          if ((bVar2 & 3) == 0) {
            TVar12 = snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                               (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                               (SnapEntry *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe4c,(BloomFilter)in_stack_fffffffffffffe40,
                               (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            local_164 = (IRRef1)TVar12;
          }
          local_168 = (pIVar15->field_0).op2;
          if (((int)(uint)bVar2 >> 2 & 3U) == 0) {
            TVar12 = snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                               (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                               (SnapEntry *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe4c,(BloomFilter)in_stack_fffffffffffffe40,
                               (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            local_168 = (IRRef1)TVar12;
          }
          if ((pIVar15->field_1).o == 'R') {
            (in_RDI->fold).ins.field_0.ot = (pIVar15->field_0).ot & 0xff9f;
            (in_RDI->fold).ins.field_0.op1 = local_164;
            (in_RDI->fold).ins.field_0.op2 = local_168;
            TVar12 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
            in_RDI->slot[uVar4 >> 0x18] = TVar12;
          }
          else {
            (in_RDI->fold).ins.field_0.ot = (pIVar15->field_0).ot;
            (in_RDI->fold).ins.field_0.op1 = local_164;
            (in_RDI->fold).ins.field_0.op2 = local_168;
            TVar12 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
            in_RDI->slot[uVar4 >> 0x18] = TVar12;
            pIVar6 = pIVar15;
            while (local_178 = pIVar6 + 1, local_178 < pIVar5 + uVar9) {
              if (*(char *)((long)pIVar6 + 0xe) == -2) {
                if (*(char *)((long)pIVar6 + 0xf) == -1) {
                  local_24 = snap_sunk_store2(in_RSI,pIVar15,local_178);
                }
                else {
                  local_24 = (uint)(pIVar15 + (int)(uint)*(byte *)((long)pIVar6 + 0xf) == local_178)
                  ;
                }
                if (local_24 == 0) goto LAB_001aa67c;
                pIVar16 = in_RSI->ir + (local_178->field_0).op1;
                local_190._0_2_ = (pIVar16->field_0).op2;
                local_194 = TVar12;
                if ((pIVar16->field_1).o == '>') {
LAB_001aa42a:
                  (in_RDI->fold).ins.field_0.ot = (pIVar16->field_0).ot;
                  (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_194;
                  (in_RDI->fold).ins.field_0.op2 = (ushort)local_190;
                  TVar13 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
                  uVar8 = (ushort)TVar13;
                }
                else {
                  in_stack_fffffffffffffe60 = in_RSI->ir + (ushort)local_190;
                  if ((pIVar16->field_1).o == '9') {
                    snap_replay_const((jit_State *)&in_stack_fffffffffffffe38->field_0,
                                      (IRIns *)CONCAT17(in_stack_fffffffffffffe37,
                                                        CONCAT16(in_stack_fffffffffffffe36,
                                                                 in_stack_fffffffffffffe30)));
                    local_190 = lj_ir_kslot((jit_State *)&in_stack_fffffffffffffe40->field_0,
                                            (TRef)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                            (IRRef)in_stack_fffffffffffffe38);
                  }
                  else {
                    local_190 = snap_replay_const((jit_State *)&in_stack_fffffffffffffe38->field_0,
                                                  (IRIns *)CONCAT17(in_stack_fffffffffffffe37,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffffe36,
                                                  in_stack_fffffffffffffe30)));
                  }
                  if (((pIVar16->field_1).o == '9') || ((pIVar16->field_1).o == '8')) {
                    in_stack_fffffffffffffe58 = in_RSI->ir + (pIVar16->field_0).op1;
                    IVar3 = (in_stack_fffffffffffffe58->field_0).op2;
                    (in_RDI->fold).ins.field_0.ot = (in_stack_fffffffffffffe58->field_0).ot;
                    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar12;
                    (in_RDI->fold).ins.field_0.op2 = IVar3;
                    local_194 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
                    goto LAB_001aa42a;
                  }
                  if ((pIVar16->field_1).o != ';') goto LAB_001aa42a;
                  in_stack_fffffffffffffe54 = TVar12 & 0xffff;
                  in_stack_fffffffffffffe50 = local_190 & 0xffff;
                  in_stack_fffffffffffffe4c = (uint)in_RDI->chain[0x3b];
                  in_stack_fffffffffffffe40 = (in_RDI->cur).ir + in_stack_fffffffffffffe4c;
                  if ((in_stack_fffffffffffffe4c <= in_stack_fffffffffffffe54) ||
                     (uVar8 = in_RDI->chain[0x3b],
                     (in_stack_fffffffffffffe40->field_0).op2 != in_stack_fffffffffffffe50))
                  goto LAB_001aa42a;
                }
                local_194._0_2_ = uVar8;
                local_18c = snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                                      (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                                      (SnapEntry *)
                                      CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                      in_stack_fffffffffffffe4c,
                                      (BloomFilter)in_stack_fffffffffffffe40,
                                      (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                if (local_18c == 0) {
                  in_stack_fffffffffffffe38 = in_RSI->ir + *(ushort *)((long)pIVar6 + 10);
                  TVar13 = snap_pref((jit_State *)&in_stack_fffffffffffffe60->field_0,
                                     (GCtrace *)&in_stack_fffffffffffffe58->field_0,
                                     (SnapEntry *)
                                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                     in_stack_fffffffffffffe4c,
                                     (BloomFilter)in_stack_fffffffffffffe40,
                                     (IRRef)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                  (in_RDI->fold).ins.field_0.ot = 0x590e;
                  (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar13;
                  (in_RDI->fold).ins.field_0.op2 = 0x1d3;
                  local_18c = lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
                }
                (in_RDI->fold).ins.field_0.ot = *(IROpT *)((long)pIVar6 + 0xc);
                (in_RDI->fold).ins.field_0.op1 = (ushort)local_194;
                (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_18c;
                lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
                pIVar6 = local_178;
              }
              else {
LAB_001aa67c:
                pcVar1 = (char *)((long)pIVar6 + 0xd);
                pIVar6 = local_178;
                if ((*pcVar1 == 'X') && ((pIVar15->field_1).o == 'Q')) {
                  (in_RDI->fold).ins.field_0.ot = 0x5800;
                  (in_RDI->fold).ins.field_0.op1 = 0;
                  (in_RDI->fold).ins.field_0.op2 = 0;
                  lj_opt_fold((jit_State *)&in_stack_fffffffffffffe38->field_0);
                }
              }
            }
          }
        }
        else {
          in_RDI->slot[uVar4 >> 0x18] = in_RDI->slot[in_RDI->slot[uVar4 >> 0x18]];
        }
      }
    }
  }
  in_RDI->base = in_RDI->slot + in_RDI->baseslot;
  in_RDI->maxslot = (uint)pSVar14->nslots - in_RDI->baseslot;
  lj_snap_add((jit_State *)
              CONCAT17(in_stack_fffffffffffffe37,
                       CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
  if (bVar7) {
    (in_RDI->fold).ins.field_0.ot = 0xf80;
    (in_RDI->fold).ins.field_0.op1 = 0;
    (in_RDI->fold).ins.field_0.op2 = 0;
    lj_ir_emit((jit_State *)&in_stack_fffffffffffffe40->field_0);
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    J->slot[s] = tr | (sn&(SNAP_CONT|SNAP_FRAME));  /* Same as TREF_* flags. */
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op1);
	if (irm_op2(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (irm_op2(m) == IRMref) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		} else if (irr->o == IR_NEWREF) {
		  IRRef allocref = tref_ref(tr);
		  IRRef keyref = tref_ref(key);
		  IRRef newref_ref = J->chain[IR_NEWREF];
		  IRIns *newref = &J->cur.ir[newref_ref];
		  lj_assertJ(irref_isk(keyref),
			     "sunk store for parent IR %04d with bad key %04d",
			     refp - REF_BIAS, keyref - REF_BIAS);
		  if (newref_ref > allocref && newref->op2 == keyref) {
		    lj_assertJ(newref->op1 == allocref,
			       "sunk store for parent IR %04d with bad tab %04d",
			       refp - REF_BIAS, allocref - REF_BIAS);
		    tmp = newref_ref;
		    goto skip_newref;
		  }
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	    skip_newref:
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}